

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallRuntimeDependencySetGenerator::GenerateInstallNameFixup
          (cmInstallRuntimeDependencySetGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *evaluatedRPaths,string *filename,string *depName,Indent indent)

{
  cmMakefile *this_00;
  pointer pbVar1;
  cmInstallRuntimeDependencySetGenerator *this_01;
  ostream *poVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rpath;
  pointer pbVar4;
  WrapQuotes wrapQuotes;
  Indent indent_00;
  string_view str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string local_a0;
  cmInstallRuntimeDependencySetGenerator *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  wrapQuotes = (WrapQuotes)filename;
  if ((this->NoInstallRPath != true) || (this->NoInstallName == false)) {
    indent_00.Level = indent.Level;
    if (((evaluatedRPaths->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start ==
         (evaluatedRPaths->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish) && (this->NoInstallName == true)) {
      indent_00.Level = indent.Level + 2;
      poVar2 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      poVar2 = std::operator<<(poVar2,"if(");
      poVar2 = std::operator<<(poVar2,this->RPathPrefix);
      poVar2 = std::operator<<(poVar2,"_");
      poVar2 = std::operator<<(poVar2,(string *)filename);
      std::operator<<(poVar2,")\n");
    }
    poVar2 = operator<<(os,(cmScriptGeneratorIndent)indent_00.Level);
    poVar2 = std::operator<<(poVar2,"set(");
    poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
    std::operator<<(poVar2,"_rpath_args)\n");
    if (this->NoInstallRPath == false) {
      poVar2 = operator<<(os,(cmScriptGeneratorIndent)indent_00.Level);
      poVar2 = std::operator<<(poVar2,"foreach(");
      poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
      poVar2 = std::operator<<(poVar2,"_rpath IN LISTS ");
      poVar2 = std::operator<<(poVar2,this->RPathPrefix);
      poVar2 = std::operator<<(poVar2,'_');
      poVar2 = std::operator<<(poVar2,(string *)filename);
      poVar2 = std::operator<<(poVar2,")\n");
      poVar2 = operator<<(poVar2,(cmScriptGeneratorIndent)(indent_00.Level + 2));
      poVar2 = std::operator<<(poVar2,"list(APPEND ");
      poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
      poVar2 = std::operator<<(poVar2,"_rpath_args -delete_rpath \"${");
      poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
      poVar2 = std::operator<<(poVar2,"_rpath}\")\n");
      poVar2 = operator<<(poVar2,(cmScriptGeneratorIndent)indent_00.Level);
      std::operator<<(poVar2,"endforeach()\n");
    }
    poVar2 = operator<<(os,(cmScriptGeneratorIndent)indent_00.Level);
    poVar2 = std::operator<<(poVar2,"execute_process(COMMAND \"");
    this_00 = this->LocalGenerator->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"CMAKE_INSTALL_NAME_TOOL",(allocator<char> *)&local_70);
    local_78 = config;
    psVar3 = cmMakefile::GetSafeDefinition(this_00,&local_a0);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    poVar2 = std::operator<<(poVar2,"\" ${");
    poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
    std::operator<<(poVar2,"_rpath_args}\n");
    std::__cxx11::string::~string((string *)&local_a0);
    local_80 = this;
    if (this->NoInstallRPath == false) {
      pbVar1 = (evaluatedRPaths->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar4 = (evaluatedRPaths->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1;
          pbVar4 = pbVar4 + 1) {
        poVar2 = operator<<(os,(cmScriptGeneratorIndent)indent_00.Level);
        poVar2 = std::operator<<(poVar2,"  -add_rpath ");
        str._M_str = (char *)0x0;
        str._M_len = (size_t)(pbVar4->_M_dataplus)._M_p;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&local_a0,(cmOutputConverter *)pbVar4->_M_string_length,str,wrapQuotes);
        poVar2 = std::operator<<(poVar2,(string *)&local_a0);
        std::operator<<(poVar2,"\n");
        std::__cxx11::string::~string((string *)&local_a0);
      }
    }
    this_01 = local_80;
    if (local_80->NoInstallName == false) {
      poVar2 = operator<<(os,(cmScriptGeneratorIndent)indent_00.Level);
      poVar2 = std::operator<<(poVar2,"  -id \"${");
      poVar2 = std::operator<<(poVar2,this_01->TmpVarPrefix);
      poVar2 = std::operator<<(poVar2,"_install_name_dir}");
      poVar2 = std::operator<<(poVar2,(string *)depName);
      std::operator<<(poVar2,"\"\n");
    }
    poVar2 = operator<<(os,(cmScriptGeneratorIndent)indent_00.Level);
    poVar2 = std::operator<<(poVar2,"  \"");
    GetDestination(&local_50,this_01,local_78);
    cmInstallGenerator::ConvertToAbsoluteDestination(&local_70,&local_50);
    cmInstallGenerator::GetDestDirPath(&local_a0,&local_70);
    poVar2 = std::operator<<(poVar2,(string *)&local_a0);
    poVar2 = std::operator<<(poVar2,"/");
    poVar2 = std::operator<<(poVar2,(string *)depName);
    std::operator<<(poVar2,"\")\n");
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    if (((evaluatedRPaths->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start ==
         (evaluatedRPaths->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish) && (this_01->NoInstallName == true)) {
      poVar2 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      std::operator<<(poVar2,"endif()\n");
    }
  }
  return;
}

Assistant:

void cmInstallRuntimeDependencySetGenerator::GenerateInstallNameFixup(
  std::ostream& os, const std::string& config,
  const std::vector<std::string>& evaluatedRPaths, const std::string& filename,
  const std::string& depName, Indent indent)
{
  if (!(this->NoInstallRPath && this->NoInstallName)) {
    auto indent2 = indent;
    if (evaluatedRPaths.empty() && this->NoInstallName) {
      indent2 = indent2.Next();
      os << indent << "if(" << this->RPathPrefix << "_" << filename << ")\n";
    }
    os << indent2 << "set(" << this->TmpVarPrefix << "_rpath_args)\n";
    if (!this->NoInstallRPath) {
      os << indent2 << "foreach(" << this->TmpVarPrefix << "_rpath IN LISTS "
         << this->RPathPrefix << '_' << filename << ")\n"
         << indent2.Next() << "list(APPEND " << this->TmpVarPrefix
         << "_rpath_args -delete_rpath \"${" << this->TmpVarPrefix
         << "_rpath}\")\n"
         << indent2 << "endforeach()\n";
    }
    os << indent2 << "execute_process(COMMAND \""
       << this->LocalGenerator->GetMakefile()->GetSafeDefinition(
            "CMAKE_INSTALL_NAME_TOOL")
       << "\" ${" << this->TmpVarPrefix << "_rpath_args}\n";
    if (!this->NoInstallRPath) {
      for (auto const& rpath : evaluatedRPaths) {
        os << indent2 << "  -add_rpath "
           << cmOutputConverter::EscapeForCMake(rpath) << "\n";
      }
    }
    if (!this->NoInstallName) {
      os << indent2 << "  -id \"${" << this->TmpVarPrefix
         << "_install_name_dir}" << depName << "\"\n";
    }
    os << indent2 << "  \""
       << GetDestDirPath(
            ConvertToAbsoluteDestination(this->GetDestination(config)))
       << "/" << depName << "\")\n";
    if (evaluatedRPaths.empty() && this->NoInstallName) {
      os << indent << "endif()\n";
    }
  }
}